

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_typed_tests.hpp
# Opt level: O0

void __thiscall
iutest::detail::
TypeParamTestInstance<syntax_tests::iu_TypedPrintToTest_x_iutest_x_Print_Test,_iutest::detail::VariadicTypeList<char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_int_*>_>
::
EachTest<iutest::detail::VariadicTypeList<unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_int_*>,_void>
::EachTest(EachTest<iutest::detail::VariadicTypeList<unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_int_*>,_void>
           *this,string *testsuite,char *name,size_t index,char *file,int line)

{
  size_t __s;
  TestSuite *p;
  allocator<char> local_59;
  string local_58;
  int local_34;
  char *pcStack_30;
  int line_local;
  char *file_local;
  size_t index_local;
  char *name_local;
  string *testsuite_local;
  EachTest<iutest::detail::VariadicTypeList<unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_int_*>,_void>
  *this_local;
  
  local_34 = line;
  pcStack_30 = file;
  file_local = (char *)index;
  index_local = (size_t)name;
  name_local = (char *)testsuite;
  testsuite_local = (string *)this;
  p = AddTestSuite(testsuite,index,file,line);
  TestSuiteMediator::TestSuiteMediator(&this->m_mediator,p);
  __s = index_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,(char *)__s,&local_59);
  TestInfo::TestInfo(&this->m_info,(iuITestSuiteMediator *)this,&local_58,
                     &(this->m_factory).super_iuFactoryBase);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  iuFactory<syntax_tests::iu_TypedPrintToTest_x_iutest_x_Print_Test<unsigned_short>_>::iuFactory
            (&this->m_factory);
  EachTest<iutest::detail::VariadicTypeList<int,_unsigned_int,_long,_unsigned_long,_int_*>,_void>::
  EachTest(&this->m_next,(string *)name_local,(char *)index_local,(size_t)(file_local + 1),
           pcStack_30,local_34);
  return;
}

Assistant:

EachTest(const ::std::string& testsuite, const char* name, size_t index, const char* file, int line)
            : m_mediator(AddTestSuite(testsuite, index, file, line))
            , m_info(&m_mediator, name, &m_factory)
            , m_next(testsuite, name, index+1, file, line)
        {
        }